

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderModifier.cpp
# Opt level: O2

void __thiscall
Assimp::Blender::BlenderModifier_Mirror::DoIt
          (BlenderModifier_Mirror *this,aiNode *out,ConversionData *conv_data,
          ElemBase *orig_modifier,Scene *param_4,Object *orig_object)

{
  TempArray<std::vector,_aiMesh> *this_00;
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ushort uVar5;
  _func_int **pp_Var6;
  aiVector3D *paVar7;
  aiFace *paVar8;
  uint *puVar9;
  uint uVar10;
  int iVar11;
  uint *__dest;
  Logger *this_01;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  float fVar18;
  uint uVar19;
  float fVar20;
  uint uVar22;
  float fVar23;
  undefined1 auVar21 [16];
  float fVar24;
  float fVar25;
  char *local_1c8 [4];
  aiMesh *mesh;
  
  if (*(int *)&orig_modifier[4]._vptr_ElemBase == 5) {
    this_00 = &conv_data->meshes;
    ::std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&this_00->arr,
               (ulong)out->mNumMeshes +
               ((long)(conv_data->meshes).arr.
                      super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(conv_data->meshes).arr.
                      super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3));
    uVar15 = 0;
    while( true ) {
      uVar19 = out->mNumMeshes;
      uVar14 = (ulong)uVar19;
      if (uVar14 <= uVar15) break;
      SceneCombiner::Copy(&mesh,(this_00->arr).
                                super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                super__Vector_impl_data._M_start[out->mMeshes[uVar15]]);
      uVar5 = *(ushort *)((long)&orig_modifier[6].dna_type + 2);
      fVar18 = 1.0;
      if ((uVar5 & 0x20) != 0) {
        fVar18 = -1.0;
      }
      auVar21 = ZEXT616(CONCAT24(uVar5,(uint)uVar5)) & _DAT_005e4740;
      uVar19 = -(uint)(auVar21._0_4_ == 0);
      uVar22 = -(uint)(auVar21._4_4_ == 0);
      fVar20 = (float)(uVar19 & 0x3f800000 | ~uVar19 & 0xbf800000);
      fVar23 = (float)(uVar22 & 0x3f800000 | ~uVar22 & 0xbf800000);
      pp_Var6 = orig_modifier[7]._vptr_ElemBase;
      lVar13 = 8;
      if (pp_Var6 == (_func_int **)0x0) {
        lVar12 = lVar13;
        for (uVar14 = 0; uVar14 < mesh->mNumVertices; uVar14 = uVar14 + 1) {
          paVar7 = mesh->mVertices;
          uVar3 = *(undefined8 *)((long)paVar7 + lVar12 + -8);
          *(ulong *)((long)paVar7 + lVar12 + -8) =
               CONCAT44((float)((ulong)uVar3 >> 0x20) * fVar23,(float)uVar3 * fVar20);
          *(float *)((long)&paVar7->x + lVar12) = *(float *)((long)&paVar7->x + lVar12) * fVar18;
          lVar12 = lVar12 + 0xc;
        }
      }
      else {
        uVar3 = *(undefined8 *)((long)pp_Var6 + 0x45c);
        fVar2 = *(float *)((long)pp_Var6 + 0x464);
        lVar12 = lVar13;
        for (uVar14 = 0; uVar14 < mesh->mNumVertices; uVar14 = uVar14 + 1) {
          paVar7 = mesh->mVertices;
          uVar4 = *(undefined8 *)((long)paVar7 + lVar12 + -8);
          fVar24 = (float)uVar3;
          fVar25 = (float)((ulong)uVar3 >> 0x20);
          pfVar1 = (float *)((long)paVar7 + lVar12 + -8);
          *pfVar1 = (fVar24 - (float)uVar4) * fVar20 + fVar24;
          pfVar1[1] = (fVar25 - (float)((ulong)uVar4 >> 0x20)) * fVar23 + fVar25;
          *(float *)((long)&paVar7->x + lVar12) =
               (fVar2 - *(float *)((long)&paVar7->x + lVar12)) * fVar18 + fVar2;
          lVar12 = lVar12 + 0xc;
        }
      }
      if (mesh->mNormals != (aiVector3D *)0x0) {
        lVar12 = lVar13;
        for (uVar14 = 0; uVar14 < mesh->mNumVertices; uVar14 = uVar14 + 1) {
          paVar7 = mesh->mNormals;
          uVar3 = *(undefined8 *)((long)paVar7 + lVar12 + -8);
          *(ulong *)((long)paVar7 + lVar12 + -8) =
               CONCAT44((float)((ulong)uVar3 >> 0x20) * fVar23,(float)uVar3 * fVar20);
          *(float *)((long)&paVar7->x + lVar12) = *(float *)((long)&paVar7->x + lVar12) * fVar18;
          lVar12 = lVar12 + 0xc;
        }
      }
      if (mesh->mTangents != (aiVector3D *)0x0) {
        lVar12 = lVar13;
        for (uVar14 = 0; uVar14 < mesh->mNumVertices; uVar14 = uVar14 + 1) {
          paVar7 = mesh->mTangents;
          uVar3 = *(undefined8 *)((long)paVar7 + lVar12 + -8);
          *(ulong *)((long)paVar7 + lVar12 + -8) =
               CONCAT44((float)((ulong)uVar3 >> 0x20) * fVar23,(float)uVar3 * fVar20);
          *(float *)((long)&paVar7->x + lVar12) = *(float *)((long)&paVar7->x + lVar12) * fVar18;
          lVar12 = lVar12 + 0xc;
        }
      }
      if (mesh->mBitangents != (aiVector3D *)0x0) {
        for (uVar14 = 0; uVar14 < mesh->mNumVertices; uVar14 = uVar14 + 1) {
          paVar7 = mesh->mBitangents;
          uVar3 = *(undefined8 *)((long)paVar7 + lVar13 + -8);
          *(ulong *)((long)paVar7 + lVar13 + -8) =
               CONCAT44((float)((ulong)uVar3 >> 0x20) * fVar23,(float)uVar3 * fVar20);
          *(float *)((long)&paVar7->x + lVar13) = *(float *)((long)&paVar7->x + lVar13) * fVar18;
          lVar13 = lVar13 + 0xc;
        }
      }
      uVar5 = *(ushort *)((long)&orig_modifier[6].dna_type + 2);
      auVar21 = ZEXT616(CONCAT24(uVar5,(uint)uVar5)) & _DAT_005e4750;
      uVar19 = -(uint)(auVar21._0_4_ == 0);
      uVar22 = -(uint)(auVar21._4_4_ == 0);
      lVar13 = 0;
      while (((lVar13 != 8 && (mesh->mTextureCoords[lVar13] != (aiVector3D *)0x0)) &&
             (uVar17 = mesh->mNumVertices, uVar17 != 0))) {
        lVar12 = 0;
        for (uVar14 = 0; uVar14 < uVar17; uVar14 = uVar14 + 1) {
          puVar9 = (uint *)((long)&mesh->mTextureCoords[lVar13]->x + lVar12);
          uVar17 = *puVar9;
          uVar10 = puVar9[1];
          puVar9 = (uint *)((long)&mesh->mTextureCoords[lVar13]->x + lVar12);
          *puVar9 = ~uVar19 & (uVar17 ^ 0x80000000) | uVar17 & uVar19;
          puVar9[1] = ~uVar22 & (uVar10 ^ 0x80000000) | uVar10 & uVar22;
          uVar17 = mesh->mNumVertices;
          lVar12 = lVar12 + 0xc;
        }
        lVar13 = lVar13 + 1;
      }
      if (fVar18 * fVar23 * fVar20 < 0.0) {
        for (uVar14 = 0; uVar14 < mesh->mNumFaces; uVar14 = uVar14 + 1) {
          paVar8 = mesh->mFaces;
          iVar11 = -1;
          for (uVar16 = 0; uVar19 = paVar8[uVar14].mNumIndices, uVar16 < uVar19 >> 1;
              uVar16 = uVar16 + 1) {
            puVar9 = paVar8[uVar14].mIndices;
            uVar19 = uVar19 + iVar11;
            uVar22 = puVar9[uVar16];
            puVar9[uVar16] = puVar9[uVar19];
            puVar9[uVar19] = uVar22;
            iVar11 = iVar11 + -1;
          }
        }
      }
      ::std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&this_00->arr,&mesh);
      uVar15 = uVar15 + 1;
    }
    uVar22 = uVar19 * 2;
    __dest = (uint *)operator_new__((ulong)uVar22 * 4);
    puVar9 = out->mMeshes;
    if (uVar14 != 0) {
      memmove(__dest,puVar9,uVar14 * 4);
    }
    for (lVar13 = 0; lVar13 != uVar14 * 4; lVar13 = lVar13 + 4) {
      *(uint *)((long)__dest + lVar13 + uVar14 * 4) = *(int *)((long)puVar9 + lVar13) + uVar19;
    }
    if (puVar9 != (uint *)0x0) {
      operator_delete__(puVar9);
      uVar22 = out->mNumMeshes * 2;
    }
    out->mMeshes = __dest;
    out->mNumMeshes = uVar22;
    this_01 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[50]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&mesh,
               (char (*) [50])"BlendModifier: Applied the `Mirror` modifier to `");
    ::std::operator<<((ostream *)&mesh,(orig_object->id).name);
    ::std::operator<<((ostream *)&mesh,"`");
    ::std::__cxx11::stringbuf::str();
    Logger::info(this_01,local_1c8[0]);
    ::std::__cxx11::string::~string((string *)local_1c8);
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mesh);
    return;
  }
  __assert_fail("mir.modifier.type == ModifierData::eModifierType_Mirror",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderModifier.cpp"
                ,0xa4,
                "virtual void Assimp::Blender::BlenderModifier_Mirror::DoIt(aiNode &, ConversionData &, const ElemBase &, const Scene &, const Object &)"
               );
}

Assistant:

void  BlenderModifier_Mirror :: DoIt(aiNode& out, ConversionData& conv_data,  const ElemBase& orig_modifier,
    const Scene& /*in*/,
    const Object& orig_object )
{
    // hijacking the ABI, see the big note in BlenderModifierShowcase::ApplyModifiers()
    const MirrorModifierData& mir = static_cast<const MirrorModifierData&>(orig_modifier);
    ai_assert(mir.modifier.type == ModifierData::eModifierType_Mirror);

    conv_data.meshes->reserve(conv_data.meshes->size() + out.mNumMeshes);

    // XXX not entirely correct, mirroring on two axes results in 4 distinct objects in blender ...

    // take all input meshes and clone them
    for (unsigned int i = 0; i < out.mNumMeshes; ++i) {
        aiMesh* mesh;
        SceneCombiner::Copy(&mesh,conv_data.meshes[out.mMeshes[i]]);

        const float xs = mir.flag & MirrorModifierData::Flags_AXIS_X ? -1.f : 1.f;
        const float ys = mir.flag & MirrorModifierData::Flags_AXIS_Y ? -1.f : 1.f;
        const float zs = mir.flag & MirrorModifierData::Flags_AXIS_Z ? -1.f : 1.f;

        if (mir.mirror_ob) {
            const aiVector3D center( mir.mirror_ob->obmat[3][0],mir.mirror_ob->obmat[3][1],mir.mirror_ob->obmat[3][2] );
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mVertices[i];

                v.x = center.x + xs*(center.x - v.x);
                v.y = center.y + ys*(center.y - v.y);
                v.z = center.z + zs*(center.z - v.z);
            }
        }
        else {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mVertices[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mNormals) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mNormals[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mTangents) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mTangents[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mBitangents) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mBitangents[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        const float us = mir.flag & MirrorModifierData::Flags_MIRROR_U ? -1.f : 1.f;
        const float vs = mir.flag & MirrorModifierData::Flags_MIRROR_V ? -1.f : 1.f;

        for (unsigned int n = 0; mesh->HasTextureCoords(n); ++n) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mTextureCoords[n][i];
                v.x *= us;v.y *= vs;
            }
        }

        // Only reverse the winding order if an odd number of axes were mirrored.
        if (xs * ys * zs < 0) {
            for( unsigned int i = 0; i < mesh->mNumFaces; i++) {
                aiFace& face = mesh->mFaces[i];
                for( unsigned int fi = 0; fi < face.mNumIndices / 2; ++fi)
                    std::swap( face.mIndices[fi], face.mIndices[face.mNumIndices - 1 - fi]);
            }
        }

        conv_data.meshes->push_back(mesh);
    }
    unsigned int* nind = new unsigned int[out.mNumMeshes*2];

    std::copy(out.mMeshes,out.mMeshes+out.mNumMeshes,nind);
    std::transform(out.mMeshes,out.mMeshes+out.mNumMeshes,nind+out.mNumMeshes,
        [&out](unsigned int n) { return out.mNumMeshes + n; });

    delete[] out.mMeshes;
    out.mMeshes = nind;
    out.mNumMeshes *= 2;

    ASSIMP_LOG_INFO_F("BlendModifier: Applied the `Mirror` modifier to `",
        orig_object.id.name,"`");
}